

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

MinimizeConstraint * __thiscall
Clasp::SharedMinimizeData::attach(SharedMinimizeData *this,Solver *s,OptParams *params,bool addRef)

{
  byte bVar1;
  MinimizeMode MVar2;
  MinimizeConstraint *pMVar3;
  byte in_CL;
  uint *in_RDX;
  undefined8 in_RSI;
  SharedMinimizeData *in_RDI;
  OptParams *unaff_retaddr;
  SharedMinimizeData *in_stack_00000008;
  UncoreMinimize *in_stack_00000010;
  MinimizeConstraint *ret;
  SharedMinimizeData *in_stack_ffffffffffffffb0;
  OptParams *in_stack_ffffffffffffffd0;
  SharedData *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  if (bVar1 != 0) {
    share(in_stack_ffffffffffffffb0);
  }
  if ((*in_RDX & 1) != 0) {
    MVar2 = mode(in_RDI);
    if (MVar2 != enumerate) {
      pMVar3 = (MinimizeConstraint *)operator_new(0x108);
      UncoreMinimize::UncoreMinimize(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      goto LAB_001ad4fc;
    }
  }
  pMVar3 = (MinimizeConstraint *)operator_new(0x48);
  DefaultMinimize::DefaultMinimize
            ((DefaultMinimize *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
LAB_001ad4fc:
  (*(pMVar3->super_Constraint)._vptr_Constraint[0x12])(pMVar3,in_RSI);
  return pMVar3;
}

Assistant:

MinimizeConstraint* SharedMinimizeData::attach(Solver& s, const OptParams& params, bool addRef) {
	if (addRef) this->share();
	MinimizeConstraint* ret;
	if (params.type == OptParams::type_bb || mode() == MinimizeMode_t::enumerate) {
		ret = new DefaultMinimize(this, params);
	}
	else {
		ret = new UncoreMinimize(this, params);
	}
	ret->attach(s);
	return ret;
}